

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O3

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,unsigned_long n)

{
  byte bVar1;
  byte *pbVar2;
  StringBuffer *pSVar3;
  byte *pbVar4;
  byte *in_RDX;
  bool bVar5;
  char fbuf [64];
  byte local_48 [72];
  
  pbVar4 = local_48;
  if (n == 0) {
    pbVar4 = local_48 + 1;
    local_48[0] = 0x30;
  }
  else {
    do {
      in_RDX = (byte *)(n / 10);
      *pbVar4 = (char)n + (char)in_RDX * -10 | 0x30;
      pbVar4 = pbVar4 + 1;
      bVar5 = (byte *)0x9 < n;
      n = (unsigned_long)in_RDX;
    } while (bVar5);
  }
  *pbVar4 = 0;
  pbVar4 = pbVar4 + -1;
  if (local_48 < pbVar4) {
    pbVar2 = local_48 + 1;
    do {
      bVar1 = pbVar2[-1];
      pbVar2[-1] = *pbVar4;
      *pbVar4 = bVar1;
      pbVar4 = pbVar4 + -1;
      in_RDX = pbVar2 + 1;
      bVar5 = pbVar2 < pbVar4;
      pbVar2 = in_RDX;
    } while (bVar5);
  }
  pSVar3 = (StringBuffer *)write(this,(int)local_48,in_RDX,(size_t)pbVar4);
  return pSVar3;
}

Assistant:

StringBuffer& operator<<(unsigned long int n)  { _UITOA(n); }